

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_plain
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel)

{
  size_t *psVar1;
  char *pcVar2;
  code *pcVar3;
  size_t sVar4;
  error_flags eVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  basic_substring<const_char> local_50;
  long local_40;
  size_t local_38;
  
  uVar6 = s.len;
  pcVar8 = s.str;
  if (uVar6 == 0) {
    uVar10 = 0;
  }
  else {
    local_40 = ilevel + 1;
    uVar10 = 0;
    uVar9 = 0;
    local_38 = ilevel;
    do {
      pcVar2 = pcVar8 + uVar9;
      uVar9 = uVar9 + 1;
      if (*pcVar2 == '\n') {
        if (uVar6 < uVar10) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          handle_error(0x1f9037,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar7 = uVar9;
        if (uVar9 == 0xffffffffffffffff) {
          uVar7 = uVar6;
        }
        if (uVar7 < uVar10) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          handle_error(0x1f9037,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (uVar6 < uVar7) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          handle_error(0x1f9037,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_50,pcVar8 + uVar10,uVar7 - uVar10);
        sVar4 = local_50.len;
        if (local_50.str != (char *)0x0 && local_50.len != 0) {
          std::ostream::write((char *)(this->
                                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream,(long)local_50.str);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + sVar4;
        }
        bVar12 = local_38 != 0xffffffffffffffff;
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
        uVar10 = uVar9;
        lVar11 = local_40;
        if (uVar9 < uVar6 && bVar12) {
          do {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
      }
    } while (uVar9 != uVar6);
  }
  if ((uVar10 <= uVar6 && uVar6 - uVar10 != 0) &&
     (basic_substring<const_char>::basic_substring(&local_50,pcVar8 + uVar10,uVar6 - uVar10),
     local_50.str != (char *)0x0 && local_50.len != 0)) {
    std::ostream::write((char *)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream,(long)local_50.str);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + local_50.len;
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_plain(csubstr s, size_t ilevel)
{
    size_t pos = 0; // tracks the last character that was already written
    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s.str[i];
        if(curr == '\n')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub);  // write everything up to (including) this newline
            this->Writer::_do_write('\n'); // write the newline again
            if(i + 1 < s.len)
                _rymlindent_nextline()     // indent the next line
            pos = i+1;
        }
    }
    // write missing characters at the end of the string
    if(pos < s.len)
    {
        csubstr sub = s.sub(pos);
        this->Writer::_do_write(sub);
    }
}